

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

WildcardPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2)

{
  Token dot;
  Token star;
  WildcardPortConnectionSyntax *this_00;
  
  this_00 = (WildcardPortConnectionSyntax *)allocate(this,0x70,8);
  dot.kind = args_1->kind;
  dot._2_1_ = args_1->field_0x2;
  dot.numFlags.raw = (args_1->numFlags).raw;
  dot.rawLen = args_1->rawLen;
  dot.info = args_1->info;
  star.kind = args_2->kind;
  star._2_1_ = args_2->field_0x2;
  star.numFlags.raw = (args_2->numFlags).raw;
  star.rawLen = args_2->rawLen;
  star.info = args_2->info;
  slang::syntax::WildcardPortConnectionSyntax::WildcardPortConnectionSyntax(this_00,args,dot,star);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }